

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sunlinsol_spbcgs.c
# Opt level: O3

SUNLinearSolver SUNLinSol_SPBCGS(N_Vector y,int pretype,int maxl)

{
  _generic_N_Vector_Ops *p_Var1;
  SUNLinearSolver __ptr;
  _generic_SUNLinearSolver_Ops *__ptr_00;
  int *piVar2;
  N_Vector p_Var3;
  int iVar4;
  
  if (3 < (uint)pretype) {
    pretype = 0;
  }
  iVar4 = 5;
  if (0 < maxl) {
    iVar4 = maxl;
  }
  p_Var1 = y->ops;
  if (p_Var1->nvclone == (_func_N_Vector_N_Vector *)0x0) {
    return (SUNLinearSolver)0x0;
  }
  if ((((p_Var1->nvdestroy != (_func_void_N_Vector *)0x0) &&
       (p_Var1->nvlinearsum != (_func_void_realtype_N_Vector_realtype_N_Vector_N_Vector *)0x0)) &&
      (p_Var1->nvprod != (_func_void_N_Vector_N_Vector_N_Vector *)0x0)) &&
     (((p_Var1->nvdiv != (_func_void_N_Vector_N_Vector_N_Vector *)0x0 &&
       (p_Var1->nvscale != (_func_void_realtype_N_Vector_N_Vector *)0x0)) &&
      ((p_Var1->nvdotprod != (_func_realtype_N_Vector_N_Vector *)0x0 &&
       (__ptr = (SUNLinearSolver)malloc(0x10), __ptr != (SUNLinearSolver)0x0)))))) {
    __ptr_00 = (_generic_SUNLinearSolver_Ops *)malloc(0x68);
    if (__ptr_00 != (_generic_SUNLinearSolver_Ops *)0x0) {
      __ptr_00->gettype = SUNLinSolGetType_SPBCGS;
      __ptr_00->setatimes = SUNLinSolSetATimes_SPBCGS;
      __ptr_00->setpreconditioner = SUNLinSolSetPreconditioner_SPBCGS;
      __ptr_00->setscalingvectors = SUNLinSolSetScalingVectors_SPBCGS;
      __ptr_00->initialize = SUNLinSolInitialize_SPBCGS;
      __ptr_00->setup = SUNLinSolSetup_SPBCGS;
      __ptr_00->solve = SUNLinSolSolve_SPBCGS;
      __ptr_00->numiters = SUNLinSolNumIters_SPBCGS;
      __ptr_00->resnorm = SUNLinSolResNorm_SPBCGS;
      __ptr_00->resid = SUNLinSolResid_SPBCGS;
      __ptr_00->lastflag = SUNLinSolLastFlag_SPBCGS;
      __ptr_00->space = SUNLinSolSpace_SPBCGS;
      __ptr_00->free = SUNLinSolFree_SPBCGS;
      piVar2 = (int *)malloc(0x90);
      if (piVar2 != (int *)0x0) {
        *piVar2 = iVar4;
        piVar2[1] = pretype;
        piVar2[2] = 0;
        piVar2[4] = 0;
        piVar2[5] = 0;
        piVar2[6] = 0;
        piVar2[7] = 0;
        p_Var3 = N_VClone(y);
        *(N_Vector *)(piVar2 + 0x18) = p_Var3;
        if (p_Var3 == (N_Vector)0x0) {
          return (SUNLinearSolver)0x0;
        }
        p_Var3 = N_VClone(y);
        *(N_Vector *)(piVar2 + 0x16) = p_Var3;
        if (p_Var3 == (N_Vector)0x0) {
          return (SUNLinearSolver)0x0;
        }
        p_Var3 = N_VClone(y);
        *(N_Vector *)(piVar2 + 0x1a) = p_Var3;
        if (p_Var3 == (N_Vector)0x0) {
          return (SUNLinearSolver)0x0;
        }
        p_Var3 = N_VClone(y);
        *(N_Vector *)(piVar2 + 0x1c) = p_Var3;
        if (p_Var3 == (N_Vector)0x0) {
          return (SUNLinearSolver)0x0;
        }
        p_Var3 = N_VClone(y);
        *(N_Vector *)(piVar2 + 0x1e) = p_Var3;
        if (p_Var3 == (N_Vector)0x0) {
          return (SUNLinearSolver)0x0;
        }
        p_Var3 = N_VClone(y);
        *(N_Vector *)(piVar2 + 0x20) = p_Var3;
        if (p_Var3 == (N_Vector)0x0) {
          return (SUNLinearSolver)0x0;
        }
        p_Var3 = N_VClone(y);
        *(N_Vector *)(piVar2 + 0x22) = p_Var3;
        if (p_Var3 == (N_Vector)0x0) {
          return (SUNLinearSolver)0x0;
        }
        piVar2[0x10] = 0;
        piVar2[0x11] = 0;
        piVar2[0x12] = 0;
        piVar2[0x13] = 0;
        piVar2[0xc] = 0;
        piVar2[0xd] = 0;
        piVar2[0xe] = 0;
        piVar2[0xf] = 0;
        piVar2[8] = 0;
        piVar2[9] = 0;
        piVar2[10] = 0;
        piVar2[0xb] = 0;
        piVar2[0x14] = 0;
        piVar2[0x15] = 0;
        __ptr->content = piVar2;
        __ptr->ops = __ptr_00;
        return __ptr;
      }
      free(__ptr_00);
    }
    free(__ptr);
  }
  return (SUNLinearSolver)0x0;
}

Assistant:

SUNLinearSolver SUNLinSol_SPBCGS(N_Vector y, int pretype, int maxl)
{
  SUNLinearSolver S;
  SUNLinearSolver_Ops ops;
  SUNLinearSolverContent_SPBCGS content;
  
  /* check for legal pretype and maxl values; if illegal use defaults */
  if ((pretype != PREC_NONE)  && (pretype != PREC_LEFT) &&
      (pretype != PREC_RIGHT) && (pretype != PREC_BOTH))
    pretype = PREC_NONE;
  if (maxl <= 0)
    maxl = SUNSPBCGS_MAXL_DEFAULT;

  /* check that the supplied N_Vector supports all requisite operations */
  if ( (y->ops->nvclone == NULL) || (y->ops->nvdestroy == NULL) ||
       (y->ops->nvlinearsum == NULL) || (y->ops->nvprod == NULL) ||
       (y->ops->nvdiv == NULL) || (y->ops->nvscale == NULL) ||
       (y->ops->nvdotprod == NULL) )
    return(NULL);

  /* Create linear solver */
  S = NULL;
  S = (SUNLinearSolver) malloc(sizeof *S);
  if (S == NULL) return(NULL);
  
  /* Create linear solver operation structure */
  ops = NULL;
  ops = (SUNLinearSolver_Ops) malloc(sizeof(struct _generic_SUNLinearSolver_Ops));
  if (ops == NULL) { free(S); return(NULL); }

  /* Attach operations */
  ops->gettype           = SUNLinSolGetType_SPBCGS;
  ops->setatimes         = SUNLinSolSetATimes_SPBCGS;
  ops->setpreconditioner = SUNLinSolSetPreconditioner_SPBCGS;
  ops->setscalingvectors = SUNLinSolSetScalingVectors_SPBCGS;
  ops->initialize        = SUNLinSolInitialize_SPBCGS;
  ops->setup             = SUNLinSolSetup_SPBCGS;
  ops->solve             = SUNLinSolSolve_SPBCGS;
  ops->numiters          = SUNLinSolNumIters_SPBCGS;
  ops->resnorm           = SUNLinSolResNorm_SPBCGS;
  ops->resid             = SUNLinSolResid_SPBCGS;
  ops->lastflag          = SUNLinSolLastFlag_SPBCGS;  
  ops->space             = SUNLinSolSpace_SPBCGS;  
  ops->free              = SUNLinSolFree_SPBCGS;

  /* Create content */
  content = NULL;
  content = (SUNLinearSolverContent_SPBCGS) malloc(sizeof(struct _SUNLinearSolverContent_SPBCGS));
  if (content == NULL) { free(ops); free(S); return(NULL); }

  /* Fill content */
  content->last_flag = 0;
  content->maxl = maxl;
  content->pretype = pretype;
  content->numiters = 0;
  content->resnorm = ZERO;
  content->r_star = N_VClone(y);
  if (content->r_star == NULL)  return(NULL);
  content->r = N_VClone(y);
  if (content->r == NULL)  return(NULL);
  content->p = N_VClone(y);
  if (content->p == NULL)  return(NULL);
  content->q = N_VClone(y);
  if (content->q == NULL)  return(NULL);
  content->u = N_VClone(y);
  if (content->u == NULL)  return(NULL);
  content->Ap = N_VClone(y);
  if (content->Ap == NULL)  return(NULL);
  content->vtemp = N_VClone(y);
  if (content->vtemp == NULL)  return(NULL);
  content->s1 = NULL;
  content->s2 = NULL;
  content->ATimes = NULL;
  content->ATData = NULL;
  content->Psetup = NULL;
  content->Psolve = NULL;
  content->PData = NULL;

  /* Attach content and ops */
  S->content = content;
  S->ops     = ops;

  return(S);
}